

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

void Omega_h::binary::write_array<int>
               (ostream *stream,Read<int> *array,bool is_compressed,bool needs_swapping)

{
  Alloc *pAVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  uint uVar5;
  size_t sVar6;
  uLong dest_bytes;
  HostRead<int> uncompressed;
  Read<int> swapped;
  ulong local_80;
  Read<signed_char> local_78;
  HostRead<int> local_68;
  uint local_58;
  undefined4 uStack_54;
  void *local_50;
  Read<int> local_48;
  ulong local_38;
  
  pAVar1 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar6 = pAVar1->size;
  }
  else {
    sVar6 = (ulong)pAVar1 >> 3;
  }
  uVar5 = (uint)(sVar6 >> 2);
  local_58 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  if (!needs_swapping) {
    local_58 = uVar5;
  }
  std::ostream::write((char *)stream,(long)&local_58);
  local_48.write_.shared_alloc_.alloc = (array->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = (array->write_).shared_alloc_.direct_ptr;
  swap_bytes<int>((binary *)&local_58,&local_48,needs_swapping);
  pAVar1 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar4 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  local_78.write_.shared_alloc_.alloc = (Alloc *)CONCAT44(uStack_54,local_58);
  if ((local_58 & 7) == 0 && local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.write_.shared_alloc_.alloc =
           (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.write_.shared_alloc_.alloc)->use_count =
           (local_78.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78.write_.shared_alloc_.direct_ptr = local_50;
  HostRead<int>::HostRead(&local_68,&local_78);
  pAVar1 = local_78.write_.shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar4 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  if (is_compressed) {
    local_80 = compressBound((long)(int)uVar5 << 2);
    pvVar3 = operator_new__(local_80);
    piVar4 = HostRead<int>::data(&local_68);
    piVar4 = nonnull<int_const>(piVar4);
    iVar2 = compress2(pvVar3,&local_80,piVar4,(long)(int)uVar5 << 2,1);
    if (iVar2 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x87);
    }
    local_38 = local_80 >> 0x38 | (local_80 & 0xff000000000000) >> 0x28 |
               (local_80 & 0xff0000000000) >> 0x18 | (local_80 & 0xff00000000) >> 8 |
               (local_80 & 0xff000000) << 8 | (local_80 & 0xff0000) << 0x18 |
               (local_80 & 0xff00) << 0x28 | local_80 << 0x38;
    if (!needs_swapping) {
      local_38 = local_80;
    }
    std::ostream::write((char *)stream,(long)&local_38);
    std::ostream::write((char *)stream,(long)pvVar3);
    operator_delete__(pvVar3);
  }
  else {
    piVar4 = HostRead<int>::data(&local_68);
    piVar4 = nonnull<int_const>(piVar4);
    std::ostream::write((char *)stream,(long)piVar4);
  }
  if (((ulong)local_68.read_.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar4 = &(local_68.read_.write_.shared_alloc_.alloc)->use_count;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      Alloc::~Alloc(local_68.read_.write_.shared_alloc_.alloc);
      operator_delete(local_68.read_.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar1 = (Alloc *)CONCAT44(uStack_54,local_58);
  if ((local_58 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    piVar4 = &pAVar1->use_count;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
    }
  }
  return;
}

Assistant:

void write_array(std::ostream& stream, Read<T> array, bool is_compressed,
    bool needs_swapping) {
  LO size = array.size();
  write_value(stream, size, needs_swapping);
  Read<T> swapped = swap_bytes(array, needs_swapping);
  HostRead<T> uncompressed(swapped);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    uLong source_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    OMEGA_H_CHECK(ret == Z_OK);
    I64 compressed_bytes = static_cast<I64>(dest_bytes);
    write_value(stream, compressed_bytes, needs_swapping);
    stream.write(reinterpret_cast<const char*>(compressed), compressed_bytes);
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.write(reinterpret_cast<const char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
}